

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

Vec_Int_t * Gia_ManSimReadFile(char *pFileIn)

{
  uint uVar1;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar2;
  
  __stream = fopen(pFileIn,"rb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open input file.");
    p = (Vec_Int_t *)0x0;
  }
  else {
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 1000;
    p->nSize = 0;
    piVar2 = (int *)malloc(4000);
    p->pArray = piVar2;
    while( true ) {
      uVar1 = fgetc(__stream);
      if (uVar1 == 0xffffffff) break;
      if ((uVar1 & 0xfffffffe) == 0x30) {
        Vec_IntPush(p,uVar1 - 0x30);
      }
    }
    fclose(__stream);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_ManSimReadFile( char * pFileIn )
{
    int c;
    Vec_Int_t * vPat;
    FILE * pFile = fopen( pFileIn, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file.\n" );
        return NULL;
    }
    vPat = Vec_IntAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
        if ( c == '0' || c == '1' )
            Vec_IntPush( vPat, c - '0' );
    fclose( pFile );
    return vPat;
}